

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

int IoTHubTransport_MQTT_Common_Subscribe(TRANSPORT_LL_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  STRING_HANDLE pSVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0xdd1;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0xdd1;
    }
    pcVar5 = "Invalid handle parameter. NULL.";
    iVar3 = 0xdd0;
  }
  else if (*(long *)((long)handle + 0x48) == 0) {
    pcVar5 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x40));
    pSVar2 = STRING_construct_sprintf("devices/%s/messages/devicebound/#",pcVar5);
    *(STRING_HANDLE *)((long)handle + 8) = pSVar2;
    if (pSVar2 != (STRING_HANDLE)0x0) {
      *(byte *)((long)handle + 0x30) = *(byte *)((long)handle + 0x30) | 4;
      iVar4 = *(int *)((long)handle + 0xf0);
      if (iVar4 - 0xe0U < 2) {
        return 0;
      }
      if (iVar4 == 0x10) {
        return 0;
      }
      if (iVar4 == 0x20) {
        return 0;
      }
      *(undefined4 *)((long)handle + 0xf0) = 0x80;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0xddf;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0xddf;
    }
    pcVar5 = "Failure constructing Message Topic";
    iVar3 = 0xdde;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0xdd7;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0xdd7;
    }
    pcVar5 = "Cannot specify modules for C2D style messages, per IoT Hub protocol limitations.";
    iVar3 = 0xdd6;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
            ,"IoTHubTransport_MQTT_Common_Subscribe",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int IoTHubTransport_MQTT_Common_Subscribe(TRANSPORT_LL_HANDLE handle)
{
    int result;
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else if (transport_data->module_id != NULL)
    {
        // This very strongly points to an internal error.  This code path should never be reachable from the IoTHub module client API.
        LogError("Cannot specify modules for C2D style messages, per IoT Hub protocol limitations.");
        result = MU_FAILURE;
    }
    else
    {
        transport_data->topic_MqttMessage = buildTopicMqttMsg(STRING_c_str(transport_data->device_id));
        if (transport_data->topic_MqttMessage == NULL)
        {
            LogError("Failure constructing Message Topic");
            result = MU_FAILURE;
        }
        else
        {
            transport_data->topics_ToSubscribe |= SUBSCRIBE_TELEMETRY_TOPIC;
            changeStateToSubscribeIfAllowed(transport_data);
            result = 0;
        }
    }
    return result;
}